

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateReplayer::Impl::parse_descriptor_set_binding_flags
          (Impl *this,Value *state,VkDescriptorSetLayoutBindingFlagsCreateInfoEXT **out_info)

{
  bool bVar1;
  SizeType SVar2;
  VkDescriptorSetLayoutBindingFlagsCreateInfo *pVVar3;
  Type pGVar4;
  VkDescriptorSetLayoutBindingFlagsCreateInfo *info;
  VkDescriptorSetLayoutBindingFlagsCreateInfoEXT **out_info_local;
  Value *state_local;
  Impl *this_local;
  
  pVVar3 = ScratchAllocator::allocate_cleared<VkDescriptorSetLayoutBindingFlagsCreateInfo>
                     (&this->allocator);
  bVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::HasMember(state,"bindingFlags");
  if (bVar1) {
    pGVar4 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)state,"bindingFlags");
    SVar2 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::Size(pGVar4);
    pVVar3->bindingCount = SVar2;
    pGVar4 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)state,"bindingFlags");
    bVar1 = parse_uints(this,pGVar4,&pVVar3->pBindingFlags);
    if (!bVar1) {
      return false;
    }
  }
  *out_info = pVVar3;
  return true;
}

Assistant:

bool StateReplayer::Impl::parse_descriptor_set_binding_flags(const Value &state,
                                                             VkDescriptorSetLayoutBindingFlagsCreateInfoEXT **out_info)
{
	auto *info = allocator.allocate_cleared<VkDescriptorSetLayoutBindingFlagsCreateInfoEXT>();
	if (state.HasMember("bindingFlags"))
	{
		info->bindingCount = state["bindingFlags"].Size();
		if (!parse_uints(state["bindingFlags"], &info->pBindingFlags))
			return false;
	}

	*out_info = info;
	return true;
}